

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLAttribute * __thiscall tinyxml2::XMLElement::FindAttribute(XMLElement *this,char *name)

{
  XMLAttribute *pXVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  
  pXVar1 = this->_rootAttribute;
  do {
    if (pXVar1 == (XMLAttribute *)0x0) {
      return (XMLAttribute *)0x0;
    }
    pcVar2 = StrPair::GetStr(&pXVar1->_name);
    if (pcVar2 == name) {
      return pXVar1;
    }
    cVar5 = *pcVar2;
    pcVar4 = name;
    if (cVar5 != '\0') {
      lVar3 = 0;
      do {
        if ((cVar5 != name[lVar3]) || ((int)lVar3 == 0x7fffffff)) {
          if ((int)lVar3 == 0x7fffffff) {
            return pXVar1;
          }
          goto LAB_001b1042;
        }
        cVar5 = pcVar2[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (cVar5 != '\0');
      if ((int)lVar3 == 0x7fffffff) {
        return pXVar1;
      }
      pcVar4 = name + lVar3;
    }
    if (*pcVar4 == '\0') {
      return pXVar1;
    }
LAB_001b1042:
    pXVar1 = pXVar1->_next;
  } while( true );
}

Assistant:

const XMLAttribute* XMLElement::FindAttribute( const char* name ) const
{
    for( XMLAttribute* a = _rootAttribute; a; a = a->_next ) {
        if ( XMLUtil::StringEqual( a->Name(), name ) ) {
            return a;
        }
    }
    return 0;
}